

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalSerialize
          (ArrayFeatureType *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_ShapeRange *this_01;
  void *data;
  bool bVar2;
  uint32_t uVar3;
  LogMessage *other;
  ulong uVar4;
  int size;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  size_t __n;
  ulong *puVar10;
  byte *ptr;
  int32_t iVar11;
  DefaultOptionalValueUnion DVar12;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar8 = (this->_shape_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    pbVar9 = stream->end_;
    if (pbVar9 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar9 = stream->end_;
    }
    if (pbVar9 <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *target = 10;
    pbVar9 = target + 1;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        target = pbVar9;
        *target = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = target + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar2);
    }
    target = target + 2;
    *pbVar9 = (byte)uVar8;
    puVar10 = (ulong *)(this->shape_).arena_or_elements_;
    puVar1 = puVar10 + (this->shape_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar4 = *puVar10;
      *target = (byte)uVar4;
      if (uVar4 < 0x80) {
        pbVar9 = target + 1;
      }
      else {
        *target = (byte)uVar4 | 0x80;
        target[1] = (byte)(uVar4 >> 7);
        pbVar9 = target + 2;
        if (0x3fff < uVar4) {
          uVar5 = (ulong)target[1];
          uVar4 = uVar4 >> 7;
          do {
            pbVar9[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar4 >> 7;
            *pbVar9 = (byte)uVar6;
            pbVar9 = pbVar9 + 1;
            uVar5 = uVar6 & 0xffffffff;
            bVar2 = 0x3fff < uVar4;
            uVar4 = uVar6;
          } while (bVar2);
        }
      }
      target = pbVar9;
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  uVar8 = this->datatype_;
  pbVar9 = target;
  if (uVar8 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar8 = this->datatype_;
    }
    *target = 0x10;
    target[1] = (byte)uVar8;
    if (uVar8 < 0x80) {
      pbVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar8 | 0x80;
      target[2] = (byte)((ulong)(long)(int)uVar8 >> 7);
      pbVar9 = target + 3;
      if (0x3fff < uVar8) {
        uVar5 = (ulong)target[2];
        uVar4 = (ulong)(long)(int)uVar8 >> 7;
        do {
          pbVar9[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar4 >> 7;
          *pbVar9 = (byte)uVar6;
          pbVar9 = pbVar9 + 1;
          uVar5 = uVar6 & 0xffffffff;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar6;
        } while (bVar2);
      }
    }
  }
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 0x15) {
    if (stream->end_ <= pbVar9) {
      pbVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar9);
    }
    this_00 = (this->ShapeFlexibility_).enumeratedshapes_;
    pbVar9[0] = 0xaa;
    pbVar9[1] = 1;
    uVar8 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    pbVar9[2] = (byte)uVar8;
    if (uVar8 < 0x80) {
      pbVar9 = pbVar9 + 3;
    }
    else {
      pbVar9 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar8,pbVar9 + 2);
    }
    pbVar9 = ArrayFeatureType_EnumeratedShapes::_InternalSerialize(this_00,pbVar9,stream);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 0x1f) {
    if (stream->end_ <= pbVar9) {
      pbVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar9);
    }
    this_01 = (this->ShapeFlexibility_).shaperange_;
    pbVar9[0] = 0xfa;
    pbVar9[1] = 1;
    uVar8 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    pbVar9[2] = (byte)uVar8;
    if (uVar8 < 0x80) {
      pbVar9 = pbVar9 + 3;
    }
    else {
      pbVar9 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar8,pbVar9 + 2);
    }
    pbVar9 = ArrayFeatureType_ShapeRange::_InternalSerialize(this_01,pbVar9,stream);
  }
  uVar3 = this->_oneof_case_[1];
  ptr = pbVar9;
  if (uVar3 == 0x29) {
    if ((pbVar9 < stream->end_) ||
       (pbVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar9),
       this->_oneof_case_[1] == 0x29)) {
      uVar8 = (this->defaultOptionalValue_).intdefaultvalue_;
      pbVar9[0] = 200;
      pbVar9[1] = 2;
      pbVar9[2] = (byte)uVar8;
      if ((ulong)(long)(int)uVar8 < 0x80) goto LAB_001f76db;
      pbVar9[2] = (byte)uVar8 | 0x80;
      uVar4 = (ulong)(long)(int)uVar8 >> 7;
      pbVar9[3] = (byte)uVar4;
      ptr = pbVar9 + 4;
      if (0x3fff < uVar8) {
        uVar5 = (ulong)pbVar9[3];
        do {
          ptr[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar4 >> 7;
          *ptr = (byte)uVar6;
          ptr = ptr + 1;
          uVar5 = uVar6 & 0xffffffff;
          bVar2 = 0x3fff < uVar4;
          uVar4 = uVar6;
        } while (bVar2);
      }
    }
    else {
      pbVar9[0] = 200;
      pbVar9[1] = 2;
      pbVar9[2] = 0;
LAB_001f76db:
      ptr = pbVar9 + 3;
    }
    uVar3 = this->_oneof_case_[1];
  }
  if (uVar3 == 0x33) {
    if (ptr < stream->end_) {
LAB_001f773d:
      iVar11 = (this->defaultOptionalValue_).intdefaultvalue_;
    }
    else {
      ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
      iVar11 = 0;
      if (this->_oneof_case_[1] == 0x33) goto LAB_001f773d;
    }
    ptr[0] = 0x9d;
    ptr[1] = 3;
    *(int32_t *)(ptr + 2) = iVar11;
    ptr = ptr + 6;
    uVar3 = this->_oneof_case_[1];
  }
  if (uVar3 != 0x3d) goto LAB_001f777b;
  if (ptr < stream->end_) {
LAB_001f7765:
    DVar12 = this->defaultOptionalValue_;
  }
  else {
    ptr = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
    DVar12.doubledefaultvalue_ = 0.0;
    if (this->_oneof_case_[1] == 0x3d) goto LAB_001f7765;
  }
  ptr[0] = 0xe9;
  ptr[1] = 3;
  *(DefaultOptionalValueUnion *)(ptr + 2) = DVar12;
  ptr = ptr + 10;
LAB_001f777b:
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)ptr < (long)__n) {
      ptr = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,ptr);
    }
    else {
      memcpy(ptr,data,__n);
      ptr = ptr + __n;
    }
  }
  return ptr;
}

Assistant:

uint8_t* ArrayFeatureType::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ArrayFeatureType)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  {
    int byte_size = _shape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_shape(), byte_size, target);
    }
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->_internal_datatype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_datatype(), target);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (_internal_has_enumeratedshapes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        21, _Internal::enumeratedshapes(this), target, stream);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (_internal_has_shaperange()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        31, _Internal::shaperange(this), target, stream);
  }

  // int32 intDefaultValue = 41;
  if (_internal_has_intdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(41, this->_internal_intdefaultvalue(), target);
  }

  // float floatDefaultValue = 51;
  if (_internal_has_floatdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(51, this->_internal_floatdefaultvalue(), target);
  }

  // double doubleDefaultValue = 61;
  if (_internal_has_doubledefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(61, this->_internal_doubledefaultvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ArrayFeatureType)
  return target;
}